

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

bool __thiscall
GlobOpt::TryOptConstFoldBrUnsignedGreaterThan
          (GlobOpt *this,Instr *instr,bool branchOnGreaterThan,Value *src1Value,int32 min1,
          int32 max1,Value *src2Value,int32 min2,int32 max2)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint uVar4;
  uint uVar5;
  ValueType *this_00;
  
  bVar2 = DoConstFold(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2881,"(DoConstFold())","DoConstFold()");
    if (!bVar2) goto LAB_00461bb6;
    *puVar3 = 0;
  }
  if (this->prePassLoop != (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x2882,"(!IsLoopPrePass())","!IsLoopPrePass()");
    if (!bVar2) {
LAB_00461bb6:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (src2Value != (Value *)0x0 && src1Value != (Value *)0x0) {
    this_00 = &src1Value->valueInfo->super_ValueType;
    if ((this->field_0xf5 & 2) == 0) {
      bVar2 = ValueType::IsInt(this_00);
      if (!bVar2) {
        return false;
      }
      bVar2 = ValueType::IsInt(&src2Value->valueInfo->super_ValueType);
    }
    else {
      bVar2 = ValueType::IsLikelyInt(this_00);
      if (!bVar2) {
        return false;
      }
      bVar2 = ValueType::IsLikelyInt(&src2Value->valueInfo->super_ValueType);
    }
    if (bVar2 != false) {
      uVar4 = min1;
      if (((min1 < 0) && (uVar4 = 0, max1 < 0)) && (uVar4 = max1, (uint)min1 < (uint)max1)) {
        uVar4 = min1;
      }
      if ((uint)max1 < (uint)min1) {
        max1 = min1;
      }
      uVar5 = min2;
      if (((min2 < 0) && (uVar5 = 0, max2 < 0)) && (uVar5 = max2, (uint)min2 < (uint)max2)) {
        uVar5 = min2;
      }
      if ((uint)max2 < (uint)min2) {
        max2 = min2;
      }
      if (uVar4 <= (uint)max2) {
        if (uVar5 < (uint)max1) {
          return false;
        }
        branchOnGreaterThan = !branchOnGreaterThan;
      }
      OptConstFoldBr(this,branchOnGreaterThan,instr,src1Value,src2Value);
      return true;
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::TryOptConstFoldBrUnsignedGreaterThan(
    IR::Instr *const instr,
    const bool branchOnGreaterThan,
    Value *const src1Value,
    const int32 min1,
    const int32 max1,
    Value *const src2Value,
    const int32 min2,
    const int32 max2)
{
    Assert(DoConstFold());
    Assert(!IsLoopPrePass());

    if(!src1Value ||
        !src2Value ||
        !(
            DoAggressiveIntTypeSpec()
                ? src1Value->GetValueInfo()->IsLikelyInt() && src2Value->GetValueInfo()->IsLikelyInt()
                : src1Value->GetValueInfo()->IsInt() && src2Value->GetValueInfo()->IsInt()
        ))
    {
        return false;
    }

    uint uMin1 = (min1 < 0 ? (max1 < 0 ? min((uint)min1, (uint)max1) : 0) : min1);
    uint uMax1 = max((uint)min1, (uint)max1);
    uint uMin2 = (min2 < 0 ? (max2 < 0 ? min((uint)min2, (uint)max2) : 0) : min2);
    uint uMax2 = max((uint)min2, (uint)max2);

    if (uMin1 > uMax2)
    {
        // Range 1 is always greater than Range 2
        OptConstFoldBr(branchOnGreaterThan, instr, src1Value, src2Value);
        return true;
    }
    if (uMax1 <= uMin2)
    {
        // Range 2 is always greater than Range 1
        OptConstFoldBr(!branchOnGreaterThan, instr, src1Value, src2Value);
        return true;
    }
    return false;
}